

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O2

void FFSClearTimestepData(SstStream Stream)

{
  uint *puVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  
  puVar1 = (uint *)Stream->ReaderMarshalData;
  lVar4 = 8;
  lVar3 = 0;
  while( true ) {
    if (Stream->WriterCohortSize <= lVar3) break;
    free(*(void **)((long)*(void **)(puVar1 + 0x10) + lVar4));
    lVar3 = lVar3 + 1;
    lVar4 = lVar4 + 0x18;
  }
  uVar5 = 0;
  memset(*(void **)(puVar1 + 0x10),0,(long)Stream->WriterCohortSize * 0x18);
  memset(*(void **)(puVar1 + 8),0,(long)Stream->WriterCohortSize << 3);
  memset(*(void **)(puVar1 + 10),0,(long)Stream->WriterCohortSize << 3);
  memset(*(void **)(puVar1 + 0xc),0,(long)Stream->WriterCohortSize << 3);
  memset(*(void **)(puVar1 + 0xe),0,(long)Stream->WriterCohortSize << 3);
  uVar2 = (ulong)*puVar1;
  if ((int)*puVar1 < 1) {
    uVar2 = uVar5;
  }
  for (; uVar2 != uVar5; uVar5 = uVar5 + 1) {
    **(undefined8 **)(*(long *)(puVar1 + 2) + uVar5 * 8) = 0;
  }
  return;
}

Assistant:

extern void FFSClearTimestepData(SstStream Stream)
{

    struct FFSReaderMarshalBase *Info = Stream->ReaderMarshalData;
    int i;
    for (i = 0; i < Stream->WriterCohortSize; i++)
    {
        if (Info->WriterInfo[i].RawBuffer)
            free(Info->WriterInfo[i].RawBuffer);
    }
    memset(Info->WriterInfo, 0, sizeof(Info->WriterInfo[0]) * Stream->WriterCohortSize);
    memset(Info->MetadataBaseAddrs, 0,
           sizeof(Info->MetadataBaseAddrs[0]) * Stream->WriterCohortSize);
    memset(Info->MetadataFieldLists, 0,
           sizeof(Info->MetadataFieldLists[0]) * Stream->WriterCohortSize);
    memset(Info->DataBaseAddrs, 0, sizeof(Info->DataBaseAddrs[0]) * Stream->WriterCohortSize);
    memset(Info->DataFieldLists, 0, sizeof(Info->DataFieldLists[0]) * Stream->WriterCohortSize);
    for (i = 0; i < Info->VarCount; i++)
    {
        Info->VarList[i]->Variable = NULL;
    }
}